

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemImpl.cpp
# Opt level: O3

string * efsw::Platform::FileSystem::getCurrentWorkingDirectory_abi_cxx11_(void)

{
  char *__s;
  string *in_RDI;
  char dir [4097];
  char acStack_1018 [4104];
  
  __s = getcwd(acStack_1018,0x1001);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if (__s == (char *)0x0) {
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
  }
  else {
    strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>();
  }
  return in_RDI;
}

Assistant:

std::string FileSystem::getCurrentWorkingDirectory() {
	char dir[PATH_MAX + 1];
	char* result = getcwd( dir, PATH_MAX + 1 );
	return result != NULL ? std::string( result ) : std::string();
}